

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenMemoryFill(BinaryenModuleRef module,BinaryenExpressionRef dest,BinaryenExpressionRef value,
                  BinaryenExpressionRef size,char *memoryName)

{
  MemoryFill *this;
  string_view sVar1;
  
  sVar1 = (string_view)getMemoryName(module,memoryName);
  this = (MemoryFill *)MixedArena::allocSpace(&module->allocator,0x38,8);
  *(undefined8 *)&(this->super_SpecificExpression<(wasm::Expression::Id)39>).super_Expression = 0;
  (this->super_SpecificExpression<(wasm::Expression::Id)39>).super_Expression.type.id = 0;
  (this->memory).super_IString.str._M_str = (char *)0x0;
  this->size = (Expression *)0x0;
  (this->memory).super_IString.str._M_len = 0;
  this->dest = (Expression *)0x0;
  this->value = (Expression *)0x0;
  (this->super_SpecificExpression<(wasm::Expression::Id)39>).super_Expression._id = MemoryFillId;
  (this->super_SpecificExpression<(wasm::Expression::Id)39>).super_Expression.type.id = 0;
  (this->memory).super_IString.str._M_len = 0;
  (this->memory).super_IString.str._M_str = (char *)0x0;
  this->dest = dest;
  this->value = value;
  this->size = size;
  (this->memory).super_IString.str = sVar1;
  wasm::MemoryFill::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenMemoryFill(BinaryenModuleRef module,
                                         BinaryenExpressionRef dest,
                                         BinaryenExpressionRef value,
                                         BinaryenExpressionRef size,
                                         const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeMemoryFill((Expression*)dest,
                      (Expression*)value,
                      (Expression*)size,
                      getMemoryName(module, memoryName)));
}